

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O0

tHalfEdge __thiscall MeshLib::Solid::vertexHalfedge(Solid *this,tVertex v0,tVertex v1)

{
  HalfEdge *pHVar1;
  tEdge this_00;
  HalfEdge **ppHVar2;
  Vertex **ppVVar3;
  TopologyException *this_01;
  tHalfEdge he;
  tEdge e;
  tVertex v1_local;
  tVertex v0_local;
  Solid *this_local;
  
  this_00 = vertexEdge(this,v0,v1);
  ppHVar2 = Edge::halfedge(this_00,0);
  pHVar1 = *ppHVar2;
  ppVVar3 = HalfEdge::vertex(pHVar1);
  if (*ppVVar3 == v1) {
    ppHVar2 = HalfEdge::he_prev(pHVar1);
    ppVVar3 = HalfEdge::vertex(*ppHVar2);
    if (*ppVVar3 == v0) {
      return pHVar1;
    }
  }
  ppHVar2 = Edge::halfedge(this_00,1);
  pHVar1 = *ppHVar2;
  ppVVar3 = HalfEdge::vertex(pHVar1);
  if (*ppVVar3 == v1) {
    ppHVar2 = HalfEdge::he_prev(pHVar1);
    ppVVar3 = HalfEdge::vertex(*ppHVar2);
    if (*ppVVar3 == v0) {
      return pHVar1;
    }
  }
  this_01 = (TopologyException *)__cxa_allocate_exception(8);
  TopologyException::TopologyException(this_01);
  __cxa_throw(this_01,&TopologyException::typeinfo,TopologyException::~TopologyException);
}

Assistant:

Solid::tHalfEdge Solid::vertexHalfedge( tVertex v0, tVertex v1 )
{
	tEdge e = vertexEdge( v0, v1 );
	tHalfEdge he = e->halfedge(0);
	if( he->vertex() == v1 && he->he_prev()->vertex() == v0 ) return he;
	he = e->halfedge(1);
	if( he->vertex() != v1 || he->he_prev()->vertex() != v0 ) throw TopologyException();
	return he;
}